

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OutFlowBC.cpp
# Opt level: O3

bool OutFlowBC::HasOutFlowBC(BCRec *_phys_bc)

{
  byte bVar1;
  byte bVar2;
  long lVar3;
  bool bVar4;
  
  lVar3 = -3;
  bVar1 = 0;
  do {
    bVar2 = bVar1;
    bVar4 = _phys_bc[1].bc[lVar3] == 2 || _phys_bc->bc[lVar3 + 3] == 2;
    lVar3 = lVar3 + 1;
    bVar1 = bVar2 | bVar4;
  } while (lVar3 != 0);
  return (bool)(bVar2 | bVar4);
}

Assistant:

bool
OutFlowBC::HasOutFlowBC (BCRec* _phys_bc)
{
    bool has_out_flow = false;
    int  numOutFlowBC = 0;

    for (int idir = 0; idir < BL_SPACEDIM; idir++)
    {
        if (_phys_bc->lo(idir) == Outflow)
        {
            has_out_flow = true;
            numOutFlowBC++;
        }

        if (_phys_bc->hi(idir) == Outflow)
        {
            has_out_flow = true;
            numOutFlowBC++;
        }
    }

    return has_out_flow;
}